

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wdgl.cpp
# Opt level: O3

void rw::wdgl::unpackattrib(float *dst,uint8 *src,AttribDesc *a,float32 scale)

{
  int iVar1;
  long lVar2;
  
  switch(a->type) {
  case 0:
    memcpy(dst,src,(long)a->size << 2);
    return;
  case 1:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 127.0;
      }
      lVar2 = 0;
      do {
        dst[lVar2] = (float)(int)(char)src[lVar2] / (float)scale;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    break;
  case 2:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 255.0;
      }
      lVar2 = 0;
      do {
        dst[lVar2] = (float)src[lVar2] / (float)scale;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    break;
  case 3:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 32767.0;
      }
      lVar2 = 0;
      do {
        dst[lVar2] = (float)(int)*(short *)(src + lVar2 * 2) / (float)scale;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
    break;
  case 4:
    iVar1 = a->size;
    if (0 < (long)iVar1) {
      if (a->normalized != 0) {
        scale = 65435.0;
      }
      lVar2 = 0;
      do {
        dst[lVar2] = (float)*(ushort *)(src + lVar2 * 2) / (float)scale;
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
    }
  }
  return;
}

Assistant:

void
unpackattrib(float *dst, uint8 *src, AttribDesc *a, float32 scale=1.0f)
{
	int8 *i8src;
	uint16 *u16src;
	int16 *i16src;

	switch(a->type){
	case 0:	// float
		memcpy(dst, src, a->size*4);
		break;

	// TODO: maybe have loop inside if?
	case 1: // byte
		i8src = (int8*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i8src[i]/scale;
			else
				dst[i] = i8src[i]/127.0f;
		}
		break;

	case 2: // ubyte
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = src[i]/scale;
			else
				dst[i] = src[i]/255.0f;
		}
		break;

	case 3: // short
		i16src = (int16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = i16src[i]/scale;
			else
				dst[i] = i16src[i]/32767.0f;
		}
		break;

	case 4: // ushort
		u16src = (uint16*)src;
		for(int i = 0; i < a->size; i++){
			if(!a->normalized)
				dst[i] = u16src[i]/scale;
			else
				dst[i] = u16src[i]/65435.0f;
		}
		break;
	}
}